

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *p,int fUseAssign)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  Vec_Str_t *pVVar5;
  int *piVar6;
  bool bVar7;
  size_t sVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  char *pcVar13;
  size_t sVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int i_3;
  Vec_Str_t *pVVar24;
  ulong uVar25;
  ulong uVar26;
  int i_5;
  Bac_Ntk_t *pBVar27;
  ulong uVar28;
  uint uVar29;
  int i;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  int local_a8;
  int local_6c;
  ulong local_68;
  ulong local_50;
  long local_40;
  
  uVar3 = (p->vType).nSize;
  uVar31 = (ulong)uVar3;
  if (0 < (int)uVar3) {
    pVVar5 = p->pDesign->vOut;
    local_6c = -1;
    local_40 = 1;
    uVar3 = 0xfffffffe;
    local_50 = 2;
    local_68 = 1;
    uVar21 = 0;
    do {
      pcVar12 = (p->vType).pArray;
      bVar16 = pcVar12[uVar21];
      bVar9 = bVar16 >> 1;
      uVar29 = (uint)bVar9;
      if ((byte)(bVar16 - 0x14) < 0xf8 && uVar29 - 5 < 0x44) {
        bVar16 = bVar16 & 0xfe;
        local_a8 = (int)uVar21;
        if (bVar16 == 0x78) {
          if ((long)(p->vFanin).nSize <= (long)uVar21) {
LAB_003a12d7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pVVar24 = p->pDesign->vOut;
          pcVar12 = Abc_NamStr(p->pDesign->pMods,(p->vFanin).pArray[uVar21]);
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate = Mio_LibraryReadGateByName(pLib,pcVar12,(char *)0x0);
          lVar30 = 0;
          do {
            cVar2 = "\nmodule %s (\n  "[lVar30 + 0xd];
            uVar29 = pVVar24->nSize;
            if (uVar29 == pVVar24->nCap) {
              if ((int)uVar29 < 0x10) {
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar13 = (char *)malloc(0x10);
                }
                else {
                  pcVar13 = (char *)realloc(pVVar24->pArray,0x10);
                }
                pVVar24->pArray = pcVar13;
                pVVar24->nCap = 0x10;
              }
              else {
                sVar14 = (ulong)uVar29 * 2;
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar13 = (char *)malloc(sVar14);
                }
                else {
                  pcVar13 = (char *)realloc(pVVar24->pArray,sVar14);
                }
                pVVar24->pArray = pcVar13;
                pVVar24->nCap = (int)sVar14;
              }
            }
            else {
              pcVar13 = pVVar24->pArray;
            }
            iVar10 = pVVar24->nSize;
            pVVar24->nSize = iVar10 + 1;
            pcVar13[iVar10] = cVar2;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 2);
          sVar14 = strlen(pcVar12);
          if (0 < (int)(uint)sVar14) {
            uVar31 = 0;
            do {
              cVar2 = pcVar12[uVar31];
              uVar29 = pVVar24->nSize;
              if (uVar29 == pVVar24->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar24->pArray,0x10);
                  }
                  pVVar24->pArray = pcVar13;
                  pVVar24->nCap = 0x10;
                }
                else {
                  sVar8 = (ulong)uVar29 * 2;
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar8);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar24->pArray,sVar8);
                  }
                  pVVar24->pArray = pcVar13;
                  pVVar24->nCap = (int)sVar8;
                }
              }
              else {
                pcVar13 = pVVar24->pArray;
              }
              iVar10 = pVVar24->nSize;
              pVVar24->nSize = iVar10 + 1;
              pcVar13[iVar10] = cVar2;
              uVar31 = uVar31 + 1;
            } while (((uint)sVar14 & 0x7fffffff) != uVar31);
          }
          uVar29 = pVVar24->nSize;
          if (uVar29 == pVVar24->nCap) {
            if ((int)uVar29 < 0x10) {
              if (pVVar24->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(0x10);
              }
              else {
                pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
              }
              pVVar24->pArray = pcVar12;
              pVVar24->nCap = 0x10;
            }
            else {
              sVar14 = (ulong)uVar29 * 2;
              if (pVVar24->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(sVar14);
              }
              else {
                pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
              }
              pVVar24->pArray = pcVar12;
              pVVar24->nCap = (int)sVar14;
            }
          }
          else {
            pcVar12 = pVVar24->pArray;
          }
          iVar10 = pVVar24->nSize;
          pVVar24->nSize = iVar10 + 1;
          pcVar12[iVar10] = ' ';
          iVar10 = Bac_ObjName(p,local_a8);
          pcVar12 = "";
          if (iVar10 != 0) {
            pcVar12 = Bac_ObjNameStr(p,local_a8);
          }
          sVar14 = strlen(pcVar12);
          if (0 < (int)(uint)sVar14) {
            uVar31 = 0;
            do {
              cVar2 = pcVar12[uVar31];
              uVar29 = pVVar24->nSize;
              if (uVar29 == pVVar24->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar24->pArray,0x10);
                  }
                  pVVar24->pArray = pcVar13;
                  pVVar24->nCap = 0x10;
                }
                else {
                  sVar8 = (ulong)uVar29 * 2;
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar8);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar24->pArray,sVar8);
                  }
                  pVVar24->pArray = pcVar13;
                  pVVar24->nCap = (int)sVar8;
                }
              }
              else {
                pcVar13 = pVVar24->pArray;
              }
              iVar10 = pVVar24->nSize;
              pVVar24->nSize = iVar10 + 1;
              pcVar13[iVar10] = cVar2;
              uVar31 = uVar31 + 1;
            } while (((uint)sVar14 & 0x7fffffff) != uVar31);
          }
          lVar30 = 0;
          do {
            cVar2 = "Node = %6s : Supp = %3d  Cone = %3d  ("[lVar30 + 0x24];
            uVar29 = pVVar24->nSize;
            if (uVar29 == pVVar24->nCap) {
              if ((int)uVar29 < 0x10) {
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = 0x10;
              }
              else {
                sVar14 = (ulong)uVar29 * 2;
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar14);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = (int)sVar14;
              }
            }
            else {
              pcVar12 = pVVar24->pArray;
            }
            iVar10 = pVVar24->nSize;
            pVVar24->nSize = iVar10 + 1;
            pcVar12[iVar10] = cVar2;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 2);
          if (uVar21 == 0) {
            uVar29 = 1;
          }
          else {
            uVar28 = 0;
            uVar31 = uVar21;
            do {
              if ((p->vType).nSize < (int)uVar31) goto LAB_003a127a;
              uVar31 = uVar31 - 1;
              if (((p->vType).pArray[uVar31 & 0xffffffff] & 0xfeU) != 6) break;
              iVar10 = (int)uVar28;
              pcVar12 = ", .";
              if (iVar10 == 0) {
                pcVar12 = ".";
              }
              lVar30 = 0;
              do {
                cVar2 = pcVar12[lVar30];
                uVar29 = pVVar24->nSize;
                if (uVar29 == pVVar24->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar24->pArray,0x10);
                    }
                    pVVar24->pArray = pcVar13;
                    pVVar24->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar29 * 2;
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar24->pArray,sVar14);
                    }
                    pVVar24->pArray = pcVar13;
                    pVVar24->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar13 = pVVar24->pArray;
                }
                iVar17 = pVVar24->nSize;
                pVVar24->nSize = iVar17 + 1;
                pcVar13[iVar17] = cVar2;
                lVar30 = lVar30 + 1;
              } while ((ulong)(iVar10 != 0) * 2 + 1 != lVar30);
              pcVar12 = Mio_GateReadPinName(pGate,iVar10);
              sVar14 = strlen(pcVar12);
              if (0 < (int)(uint)sVar14) {
                uVar28 = 0;
                do {
                  cVar2 = pcVar12[uVar28];
                  uVar29 = pVVar24->nSize;
                  if (uVar29 == pVVar24->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar13 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar13 = (char *)realloc(pVVar24->pArray,0x10);
                      }
                      pVVar24->pArray = pcVar13;
                      pVVar24->nCap = 0x10;
                    }
                    else {
                      sVar8 = (ulong)uVar29 * 2;
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar13 = (char *)malloc(sVar8);
                      }
                      else {
                        pcVar13 = (char *)realloc(pVVar24->pArray,sVar8);
                      }
                      pVVar24->pArray = pcVar13;
                      pVVar24->nCap = (int)sVar8;
                    }
                  }
                  else {
                    pcVar13 = pVVar24->pArray;
                  }
                  iVar17 = pVVar24->nSize;
                  pVVar24->nSize = iVar17 + 1;
                  pcVar13[iVar17] = cVar2;
                  uVar28 = uVar28 + 1;
                } while (((uint)sVar14 & 0x7fffffff) != uVar28);
              }
              uVar29 = pVVar24->nSize;
              if (uVar29 == pVVar24->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar29 * 2;
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = (int)sVar14;
                }
              }
              else {
                pcVar12 = pVVar24->pArray;
              }
              iVar17 = pVVar24->nSize;
              pVVar24->nSize = iVar17 + 1;
              pcVar12[iVar17] = '(';
              Bac_ManWriteSig(p,(int)uVar31);
              uVar29 = pVVar24->nSize;
              if (uVar29 == pVVar24->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar29 * 2;
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = (int)sVar14;
                }
              }
              else {
                pcVar12 = pVVar24->pArray;
              }
              iVar17 = pVVar24->nSize;
              pVVar24->nSize = iVar17 + 1;
              pcVar12[iVar17] = ')';
              uVar28 = (ulong)(iVar10 + 1);
            } while (uVar21 != uVar28);
            uVar29 = local_a8 + 1;
          }
          uVar18 = (p->vType).nSize;
          if ((int)uVar29 < (int)uVar18) {
            uVar31 = (ulong)uVar29;
            uVar28 = uVar21 & 0xffffffff;
            do {
              uVar25 = uVar31;
              if ((int)uVar28 < -1) goto LAB_003a127a;
              pcVar12 = (p->vType).pArray;
              if ((pcVar12[uVar25] & 0xfeU) != 8) break;
              if ((long)(int)uVar18 <= (long)uVar21) goto LAB_003a127a;
              uVar31 = uVar21;
              if (((byte)pcVar12[uVar21] >> 1) - 0x49 < 0xffffffbc) goto LAB_003a1299;
              do {
                if ((long)uVar31 < 1) {
                  uVar31 = 0;
                  goto LAB_0039f5c3;
                }
                if (uVar18 <= local_a8 - 1U) goto LAB_003a127a;
                lVar30 = uVar31 - 1;
                uVar31 = uVar31 - 1;
              } while ((pcVar12[lVar30] & 0xfeU) == 6);
              uVar31 = (ulong)((int)uVar31 + 1);
LAB_0039f5c3:
              pcVar12 = ", .";
              if (uVar31 == uVar21) {
                pcVar12 = ".";
              }
              lVar30 = 0;
              do {
                cVar2 = pcVar12[lVar30];
                uVar29 = pVVar24->nSize;
                if (uVar29 == pVVar24->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar24->pArray,0x10);
                    }
                    pVVar24->pArray = pcVar13;
                    pVVar24->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar29 * 2;
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar24->pArray,sVar14);
                    }
                    pVVar24->pArray = pcVar13;
                    pVVar24->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar13 = pVVar24->pArray;
                }
                iVar10 = pVVar24->nSize;
                pVVar24->nSize = iVar10 + 1;
                pcVar13[iVar10] = cVar2;
                lVar30 = lVar30 + 1;
              } while ((ulong)(uVar31 != uVar21) * 2 + 1 != lVar30);
              pcVar12 = Mio_GateReadOutName(pGate);
              sVar14 = strlen(pcVar12);
              if (0 < (int)(uint)sVar14) {
                uVar31 = 0;
                do {
                  cVar2 = pcVar12[uVar31];
                  uVar29 = pVVar24->nSize;
                  if (uVar29 == pVVar24->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar13 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar13 = (char *)realloc(pVVar24->pArray,0x10);
                      }
                      pVVar24->pArray = pcVar13;
                      pVVar24->nCap = 0x10;
                    }
                    else {
                      sVar8 = (ulong)uVar29 * 2;
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar13 = (char *)malloc(sVar8);
                      }
                      else {
                        pcVar13 = (char *)realloc(pVVar24->pArray,sVar8);
                      }
                      pVVar24->pArray = pcVar13;
                      pVVar24->nCap = (int)sVar8;
                    }
                  }
                  else {
                    pcVar13 = pVVar24->pArray;
                  }
                  iVar10 = pVVar24->nSize;
                  pVVar24->nSize = iVar10 + 1;
                  pcVar13[iVar10] = cVar2;
                  uVar31 = uVar31 + 1;
                } while (((uint)sVar14 & 0x7fffffff) != uVar31);
              }
              uVar29 = pVVar24->nSize;
              if (uVar29 == pVVar24->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar29 * 2;
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = (int)sVar14;
                }
              }
              else {
                pcVar12 = pVVar24->pArray;
              }
              iVar10 = pVVar24->nSize;
              pVVar24->nSize = iVar10 + 1;
              pcVar12[iVar10] = '(';
              Bac_ManWriteSig(p,(int)uVar25);
              uVar29 = pVVar24->nSize;
              if (uVar29 == pVVar24->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar29 * 2;
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = (int)sVar14;
                }
              }
              else {
                pcVar12 = pVVar24->pArray;
              }
              iVar10 = pVVar24->nSize;
              pVVar24->nSize = iVar10 + 1;
              pcVar12[iVar10] = ')';
              uVar18 = (p->vType).nSize;
              uVar31 = uVar25 + 1;
              uVar28 = uVar25;
            } while ((int)(uVar25 + 1) < (int)uVar18);
          }
          lVar30 = 0;
          do {
            cVar2 = "\n  );\n"[lVar30 + 3];
            uVar29 = pVVar24->nSize;
            if (uVar29 == pVVar24->nCap) {
              if ((int)uVar29 < 0x10) {
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = 0x10;
              }
              else {
                sVar14 = (ulong)uVar29 * 2;
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar14);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = (int)sVar14;
              }
            }
            else {
              pcVar12 = pVVar24->pArray;
            }
            iVar10 = pVVar24->nSize;
            pVVar24->nSize = iVar10 + 1;
            pcVar12[iVar10] = cVar2;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 3);
        }
        else if ((fUseAssign == 0) || (bVar16 == 10)) {
          iVar10 = pVVar5->nSize;
          if (bVar16 == 10) {
            if ((long)(p->vFanin).nSize <= (long)uVar21) goto LAB_003a12d7;
            iVar17 = (p->vFanin).pArray[uVar21];
            if (((long)iVar17 < 1) || (p->pDesign->nNtks < iVar17)) {
              pBVar27 = (Bac_Ntk_t *)0x0;
            }
            else {
              pBVar27 = p->pDesign->pNtks + iVar17;
            }
            lVar30 = 0;
            do {
              cVar2 = "\nmodule %s (\n  "[lVar30 + 0xd];
              uVar29 = pVVar5->nSize;
              if (uVar29 == pVVar5->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar29 * 2;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = (int)sVar14;
                }
              }
              else {
                pcVar12 = pVVar5->pArray;
              }
              iVar17 = pVVar5->nSize;
              pVVar5->nSize = iVar17 + 1;
              pcVar12[iVar17] = cVar2;
              lVar30 = lVar30 + 1;
            } while (lVar30 != 2);
            pcVar12 = Abc_NamStr(pBVar27->pDesign->pStrs,pBVar27->NameId);
            sVar14 = strlen(pcVar12);
            if (0 < (int)(uint)sVar14) {
              uVar31 = 0;
              do {
                cVar2 = pcVar12[uVar31];
                uVar29 = pVVar5->nSize;
                if (uVar29 == pVVar5->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    pVVar5->pArray = pcVar13;
                    pVVar5->nCap = 0x10;
                  }
                  else {
                    sVar8 = (ulong)uVar29 * 2;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar8);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,sVar8);
                    }
                    pVVar5->pArray = pcVar13;
                    pVVar5->nCap = (int)sVar8;
                  }
                }
                else {
                  pcVar13 = pVVar5->pArray;
                }
                iVar17 = pVVar5->nSize;
                pVVar5->nSize = iVar17 + 1;
                pcVar13[iVar17] = cVar2;
                uVar31 = uVar31 + 1;
              } while (((uint)sVar14 & 0x7fffffff) != uVar31);
            }
            uVar29 = pVVar5->nSize;
            if (uVar29 == pVVar5->nCap) {
              if ((int)uVar29 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = 0x10;
              }
              else {
                sVar14 = (ulong)uVar29 * 2;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar14);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = (int)sVar14;
              }
            }
            else {
              pcVar12 = pVVar5->pArray;
            }
            iVar17 = pVVar5->nSize;
            pVVar5->nSize = iVar17 + 1;
            pcVar12[iVar17] = ' ';
            iVar17 = Bac_ObjName(p,local_a8);
            pcVar12 = "";
            if (iVar17 != 0) {
              pcVar12 = Bac_ObjNameStr(p,local_a8);
            }
            sVar14 = strlen(pcVar12);
            if (0 < (int)(uint)sVar14) {
              uVar31 = 0;
              do {
                cVar2 = pcVar12[uVar31];
                uVar29 = pVVar5->nSize;
                if (uVar29 == pVVar5->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    pVVar5->pArray = pcVar13;
                    pVVar5->nCap = 0x10;
                  }
                  else {
                    sVar8 = (ulong)uVar29 * 2;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar8);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,sVar8);
                    }
                    pVVar5->pArray = pcVar13;
                    pVVar5->nCap = (int)sVar8;
                  }
                }
                else {
                  pcVar13 = pVVar5->pArray;
                }
                iVar17 = pVVar5->nSize;
                pVVar5->nSize = iVar17 + 1;
                pcVar13[iVar17] = cVar2;
                uVar31 = uVar31 + 1;
              } while (((uint)sVar14 & 0x7fffffff) != uVar31);
            }
            lVar30 = 0;
            do {
              cVar2 = "Node = %6s : Supp = %3d  Cone = %3d  ("[lVar30 + 0x24];
              uVar29 = pVVar5->nSize;
              if (uVar29 == pVVar5->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar29 * 2;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = (int)sVar14;
                }
              }
              else {
                pcVar12 = pVVar5->pArray;
              }
              iVar17 = pVVar5->nSize;
              pVVar5->nSize = iVar17 + 1;
              pcVar12[iVar17] = cVar2;
              lVar30 = lVar30 + 1;
            } while (lVar30 != 2);
            iVar17 = (pBVar27->vInfo).nSize;
            if (iVar17 + 2U < 5) {
              __assert_fail("Bac_NtkInfoNum(pModel)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x1fa,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
            iVar19 = 0;
            uVar29 = 0;
            if (2 < iVar17) {
              uVar29 = 0;
              iVar19 = 0;
              lVar30 = 0;
              do {
                piVar6 = (pBVar27->vInfo).pArray;
                uVar18 = piVar6[lVar30];
                if ((int)uVar18 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                ,0x13d,"int Abc_Lit2Var2(int)");
                }
                iVar17 = piVar6[lVar30 + 1];
                iVar11 = piVar6[lVar30 + 2];
                if (lVar30 != 0) {
                  lVar20 = 0;
                  do {
                    cVar2 = "    \"%s\", "[lVar20 + 8];
                    uVar4 = pVVar5->nSize;
                    if (uVar4 == pVVar5->nCap) {
                      if ((int)uVar4 < 0x10) {
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                        }
                        pVVar5->pArray = pcVar12;
                        pVVar5->nCap = 0x10;
                      }
                      else {
                        sVar14 = (ulong)uVar4 * 2;
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(sVar14);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                        }
                        pVVar5->pArray = pcVar12;
                        pVVar5->nCap = (int)sVar14;
                      }
                    }
                    else {
                      pcVar12 = pVVar5->pArray;
                    }
                    iVar23 = pVVar5->nSize;
                    pVVar5->nSize = iVar23 + 1;
                    pcVar12[iVar23] = cVar2;
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 2);
                }
                iVar23 = pVVar5->nSize;
                iVar22 = iVar23;
                if (iVar10 + 0x46 < iVar23) {
                  lVar20 = 0;
                  do {
                    cVar2 = "module %s (\n    "[lVar20 + 0xb];
                    if (iVar22 == pVVar5->nCap) {
                      if (iVar22 < 0x10) {
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                        }
                        pVVar5->pArray = pcVar12;
                        pVVar5->nCap = 0x10;
                      }
                      else {
                        uVar4 = iVar22 * 2;
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc((ulong)uVar4);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar5->pArray,(ulong)uVar4);
                        }
                        pVVar5->pArray = pcVar12;
                        pVVar5->nCap = uVar4;
                      }
                    }
                    else {
                      pcVar12 = pVVar5->pArray;
                    }
                    iVar10 = pVVar5->nSize;
                    pVVar5->nSize = iVar10 + 1;
                    pcVar12[iVar10] = cVar2;
                    lVar20 = lVar20 + 1;
                    iVar22 = pVVar5->nSize;
                    iVar10 = iVar23;
                  } while (lVar20 != 5);
                }
                if (iVar22 == pVVar5->nCap) {
                  if (iVar22 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    pVVar5->pArray = pcVar12;
                    pVVar5->nCap = 0x10;
                  }
                  else {
                    uVar4 = iVar22 * 2;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc((ulong)uVar4);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,(ulong)uVar4);
                    }
                    pVVar5->pArray = pcVar12;
                    pVVar5->nCap = uVar4;
                  }
                }
                else {
                  pcVar12 = pVVar5->pArray;
                }
                iVar23 = pVVar5->nSize;
                pVVar5->nSize = iVar23 + 1;
                pcVar12[iVar23] = '.';
                pcVar12 = Abc_NamStr(p->pDesign->pStrs,uVar18 >> 2);
                sVar14 = strlen(pcVar12);
                if (0 < (int)(uint)sVar14) {
                  uVar31 = 0;
                  do {
                    cVar2 = pcVar12[uVar31];
                    uVar4 = pVVar5->nSize;
                    if (uVar4 == pVVar5->nCap) {
                      if ((int)uVar4 < 0x10) {
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar13 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                        }
                        pVVar5->pArray = pcVar13;
                        pVVar5->nCap = 0x10;
                      }
                      else {
                        sVar8 = (ulong)uVar4 * 2;
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar13 = (char *)malloc(sVar8);
                        }
                        else {
                          pcVar13 = (char *)realloc(pVVar5->pArray,sVar8);
                        }
                        pVVar5->pArray = pcVar13;
                        pVVar5->nCap = (int)sVar8;
                      }
                    }
                    else {
                      pcVar13 = pVVar5->pArray;
                    }
                    iVar23 = pVVar5->nSize;
                    pVVar5->nSize = iVar23 + 1;
                    pcVar13[iVar23] = cVar2;
                    uVar31 = uVar31 + 1;
                  } while (((uint)sVar14 & 0x7fffffff) != uVar31);
                }
                uVar4 = pVVar5->nSize;
                if (uVar4 == pVVar5->nCap) {
                  if ((int)uVar4 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    pVVar5->pArray = pcVar12;
                    pVVar5->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar4 * 2;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                    }
                    pVVar5->pArray = pcVar12;
                    pVVar5->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar12 = pVVar5->pArray;
                }
                iVar23 = pVVar5->nSize;
                pVVar5->nSize = iVar23 + 1;
                pcVar12[iVar23] = '(';
                iVar11 = iVar11 - iVar17;
                iVar17 = -iVar11;
                if (0 < iVar11) {
                  iVar17 = iVar11;
                }
                iVar17 = iVar17 + 1;
                if ((uVar18 & 3) == 2) {
                  if ((long)(p->vType).nSize <= (long)uVar21) goto LAB_003a127a;
                  if (((byte)(p->vType).pArray[uVar21] >> 1) - 0x49 < 0xffffffbc) {
                    __assert_fail("Bac_ObjIsBox(p, b)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                  ,0x134,"int Bac_BoxBo(Bac_Ntk_t *, int, int)");
                  }
                  Bac_ManWriteConcat(p,local_a8 + 1 + iVar19,iVar17);
                  iVar19 = iVar17 + iVar19;
                }
                else {
                  if ((uVar18 & 3) != 1) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                                  ,0x20e,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
                  }
                  if ((long)(p->vType).nSize <= (long)uVar21) goto LAB_003a127a;
                  if (((byte)(p->vType).pArray[uVar21] >> 1) - 0x49 < 0xffffffbc) {
                    __assert_fail("Bac_ObjIsBox(p, b)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                  ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
                  }
                  Bac_ManWriteConcat(p,~uVar29 + local_a8,iVar17);
                  uVar29 = uVar29 + iVar17;
                }
                uVar18 = pVVar5->nSize;
                if (uVar18 == pVVar5->nCap) {
                  if ((int)uVar18 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    pVVar5->pArray = pcVar12;
                    pVVar5->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar18 * 2;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                    }
                    pVVar5->pArray = pcVar12;
                    pVVar5->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar12 = pVVar5->pArray;
                }
                iVar17 = pVVar5->nSize;
                pVVar5->nSize = iVar17 + 1;
                pcVar12[iVar17] = ')';
                iVar17 = (int)lVar30;
                lVar30 = lVar30 + 3;
              } while (iVar17 + 5 < (pBVar27->vInfo).nSize);
            }
            uVar18 = (p->vType).nSize;
            if ((long)(int)uVar18 <= (long)uVar21) goto LAB_003a127a;
            pcVar12 = (p->vType).pArray;
            if (((byte)pcVar12[uVar21] >> 1) - 0x49 < 0xffffffbc) {
LAB_003a1299:
              __assert_fail("Bac_ObjIsBox(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x130,"int Bac_BoxBiNum(Bac_Ntk_t *, int)");
            }
            uVar31 = uVar21;
            do {
              if ((long)uVar31 < 1) {
                iVar10 = 0;
                goto LAB_003a0388;
              }
              if (uVar18 <= local_a8 - 1U) goto LAB_003a127a;
              lVar30 = uVar31 - 1;
              uVar31 = uVar31 - 1;
            } while ((pcVar12[lVar30] & 0xfeU) == 6);
            iVar10 = (int)uVar31 + 1;
LAB_003a0388:
            if (uVar29 != local_a8 - iVar10) {
              __assert_fail("i == Bac_BoxBiNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x211,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
            uVar31 = local_68;
            iVar10 = local_6c;
            do {
              iVar17 = uVar18 - 1;
              if ((ulong)(long)(int)uVar18 <= uVar31) break;
              pbVar1 = (byte *)(pcVar12 + uVar31);
              iVar10 = iVar10 + 1;
              uVar31 = uVar31 + 1;
              iVar17 = iVar10;
            } while ((*pbVar1 & 0xfe) == 8);
            if (iVar19 != iVar17 - local_a8) {
              __assert_fail("o == Bac_BoxBoNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x212,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
          }
          else {
            DAT_00cbf328 = &Bac_BoxCollectRanges_pArray;
            _Bac_BoxCollectRanges_Bits = 10;
            pVVar24 = pVVar5;
            uVar28 = uVar21;
            lVar30 = local_40;
            uVar29 = uVar3;
            if (uVar21 != 0) {
              do {
                uVar31 = (ulong)(p->vType).nSize;
                if ((long)uVar31 < (long)uVar28) goto LAB_003a127a;
                uVar25 = uVar28 - 1;
                pcVar12 = (p->vType).pArray;
                bVar16 = pcVar12[uVar25];
                pVVar24 = (Vec_Str_t *)CONCAT71((int7)((ulong)pVVar24 >> 8),bVar16);
                if ((bVar16 & 0xfe) != 6) goto LAB_0039eb25;
                if ((bVar16 & 1) == 0) {
                  lVar20 = lVar30;
                  uVar18 = uVar29;
                  if (bVar16 != 6) {
                    __assert_fail("Bac_ObjIsBi(p, i) && !Bac_ObjBit(p, i)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                  ,0x139,"int Bac_BoxBiRange(Bac_Ntk_t *, int)");
                  }
                  do {
                    if (lVar20 == 0) {
                      uVar18 = 0xffffffff;
                      goto LAB_0039eb03;
                    }
                    bVar16 = pcVar12[uVar18];
                    pVVar24 = (Vec_Str_t *)(ulong)CONCAT31((int3)(uVar18 >> 8),bVar16);
                    if ((bVar16 & 0xfe) != 6) goto LAB_0039eb03;
                    lVar20 = lVar20 + 1;
                    uVar18 = uVar18 - 1;
                  } while ((bVar16 & 1) != 0);
                  uVar18 = -(int)lVar20;
LAB_0039eb03:
                  Vec_IntPush((Vec_Int_t *)(ulong)((int)uVar25 - uVar18),(int)pVVar24);
                }
                bVar7 = 1 < (long)uVar28;
                uVar28 = uVar25;
                lVar30 = lVar30 + 1;
                uVar29 = uVar29 - 1;
              } while (bVar7);
              uVar31 = (ulong)(uint)(p->vType).nSize;
            }
LAB_0039eb25:
            uVar28 = uVar21 + 1;
            uVar29 = (uint)uVar31;
            uVar15 = local_50;
            uVar26 = uVar28;
            uVar25 = uVar21;
            if ((long)uVar28 < (long)(int)uVar29) {
              do {
                uVar32 = uVar26;
                uVar29 = (uint)uVar31;
                if ((int)uVar25 < -1) goto LAB_003a127a;
                pcVar12 = (p->vType).pArray;
                bVar16 = pcVar12[uVar32];
                if ((bVar16 & 0xfe) != 8) break;
                if ((bVar16 & 1) == 0) {
                  if (bVar16 != 8) {
                    __assert_fail("Bac_ObjIsBo(p, i) && !Bac_ObjBit(p, i)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                  ,0x13a,"int Bac_BoxBoRange(Bac_Ntk_t *, int)");
                  }
                  uVar26 = uVar32 & 0xffffffff;
                  uVar25 = uVar15;
                  while (uVar18 = uVar29, uVar25 < (uVar31 & 0xffffffff)) {
                    bVar16 = pcVar12[uVar25];
                    uVar18 = (int)uVar26 + 1;
                    uVar26 = (ulong)uVar18;
                    if (((bVar16 & 0xfe) != 8) || (uVar25 = uVar25 + 1, (bVar16 & 1) == 0)) break;
                  }
                  Vec_IntPush((Vec_Int_t *)(ulong)(uVar18 - (int)uVar32),(int)uVar25);
                  uVar31 = (ulong)(uint)(p->vType).nSize;
                }
                uVar29 = (uint)uVar31;
                uVar15 = uVar15 + 1;
                uVar26 = uVar32 + 1;
                uVar25 = uVar32;
              } while ((int)(uVar32 + 1) < (int)uVar29);
            }
            if (9 < DAT_00cbf324) {
              __assert_fail("Vec_IntSize(vBits) < 10",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x1ef,"Vec_Int_t *Bac_BoxCollectRanges(Bac_Ntk_t *, int)");
            }
            if (((long)(int)uVar29 <= (long)uVar21) ||
               (pcVar12 = Bac_NtkGenerateName(p,(uint)((byte)(p->vType).pArray[uVar21] >> 1),
                                              (Vec_Int_t *)&Bac_BoxCollectRanges_Bits),
               (long)(p->vType).nSize <= (long)uVar21)) {
LAB_003a127a:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            lVar30 = *(long *)((long)p->pDesign->pPrimSymbs +
                              (ulong)((byte)(p->vType).pArray[uVar21] & 0xfffffffe) * 4);
            lVar20 = 0;
            do {
              cVar2 = "\nmodule %s (\n  "[lVar20 + 0xd];
              uVar29 = pVVar5->nSize;
              if (uVar29 == pVVar5->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  pVVar5->pArray = pcVar13;
                  pVVar5->nCap = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar29 * 2;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar5->pArray,sVar14);
                  }
                  pVVar5->pArray = pcVar13;
                  pVVar5->nCap = (int)sVar14;
                }
              }
              else {
                pcVar13 = pVVar5->pArray;
              }
              iVar17 = pVVar5->nSize;
              pVVar5->nSize = iVar17 + 1;
              pcVar13[iVar17] = cVar2;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 2);
            sVar14 = strlen(pcVar12);
            if (0 < (int)(uint)sVar14) {
              uVar31 = 0;
              do {
                cVar2 = pcVar12[uVar31];
                uVar29 = pVVar5->nSize;
                if (uVar29 == pVVar5->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    pVVar5->pArray = pcVar13;
                    pVVar5->nCap = 0x10;
                  }
                  else {
                    sVar8 = (ulong)uVar29 * 2;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar8);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,sVar8);
                    }
                    pVVar5->pArray = pcVar13;
                    pVVar5->nCap = (int)sVar8;
                  }
                }
                else {
                  pcVar13 = pVVar5->pArray;
                }
                iVar17 = pVVar5->nSize;
                pVVar5->nSize = iVar17 + 1;
                pcVar13[iVar17] = cVar2;
                uVar31 = uVar31 + 1;
              } while (((uint)sVar14 & 0x7fffffff) != uVar31);
            }
            uVar29 = pVVar5->nSize;
            if (uVar29 == pVVar5->nCap) {
              if ((int)uVar29 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = 0x10;
              }
              else {
                sVar14 = (ulong)uVar29 * 2;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar14);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = (int)sVar14;
              }
            }
            else {
              pcVar12 = pVVar5->pArray;
            }
            iVar17 = pVVar5->nSize;
            pVVar5->nSize = iVar17 + 1;
            pcVar12[iVar17] = ' ';
            iVar17 = Bac_ObjName(p,local_a8);
            pcVar12 = "";
            if (iVar17 != 0) {
              pcVar12 = Bac_ObjNameStr(p,local_a8);
            }
            sVar14 = strlen(pcVar12);
            if (0 < (int)(uint)sVar14) {
              uVar31 = 0;
              do {
                cVar2 = pcVar12[uVar31];
                uVar29 = pVVar5->nSize;
                if (uVar29 == pVVar5->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    pVVar5->pArray = pcVar13;
                    pVVar5->nCap = 0x10;
                  }
                  else {
                    sVar8 = (ulong)uVar29 * 2;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar13 = (char *)malloc(sVar8);
                    }
                    else {
                      pcVar13 = (char *)realloc(pVVar5->pArray,sVar8);
                    }
                    pVVar5->pArray = pcVar13;
                    pVVar5->nCap = (int)sVar8;
                  }
                }
                else {
                  pcVar13 = pVVar5->pArray;
                }
                iVar17 = pVVar5->nSize;
                pVVar5->nSize = iVar17 + 1;
                pcVar13[iVar17] = cVar2;
                uVar31 = uVar31 + 1;
              } while (((uint)sVar14 & 0x7fffffff) != uVar31);
            }
            lVar20 = 0;
            do {
              cVar2 = "Node = %6s : Supp = %3d  Cone = %3d  ("[lVar20 + 0x24];
              uVar29 = pVVar5->nSize;
              if (uVar29 == pVVar5->nCap) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar29 * 2;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = (int)sVar14;
                }
              }
              else {
                pcVar12 = pVVar5->pArray;
              }
              iVar17 = pVVar5->nSize;
              pVVar5->nSize = iVar17 + 1;
              pcVar12[iVar17] = cVar2;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 2);
            if (uVar21 == 0) {
              uVar31 = 0;
            }
            else {
              uVar31 = 0;
              uVar25 = uVar21;
              do {
                if ((p->vType).nSize < (int)uVar25) goto LAB_003a127a;
                uVar15 = uVar25 - 1;
                bVar16 = (p->vType).pArray[uVar15 & 0xffffffff];
                if ((bVar16 & 0xfe) != 6) break;
                if ((bVar16 & 1) == 0) {
                  iVar17 = (int)uVar31;
                  if ((iVar17 < 0) || (DAT_00cbf324 <= iVar17)) goto LAB_003a12d7;
                  iVar19 = DAT_00cbf328[uVar31];
                  if (iVar17 != 0) {
                    lVar20 = 0;
                    do {
                      cVar2 = "    \"%s\", "[lVar20 + 8];
                      uVar29 = pVVar5->nSize;
                      if (uVar29 == pVVar5->nCap) {
                        if ((int)uVar29 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          pVVar5->pArray = pcVar12;
                          pVVar5->nCap = 0x10;
                        }
                        else {
                          sVar14 = (ulong)uVar29 * 2;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(sVar14);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                          }
                          pVVar5->pArray = pcVar12;
                          pVVar5->nCap = (int)sVar14;
                        }
                      }
                      else {
                        pcVar12 = pVVar5->pArray;
                      }
                      iVar11 = pVVar5->nSize;
                      pVVar5->nSize = iVar11 + 1;
                      pcVar12[iVar11] = cVar2;
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 2);
                  }
                  iVar11 = pVVar5->nSize;
                  iVar23 = iVar11;
                  if (iVar10 + 0x46 < iVar11) {
                    lVar20 = 0;
                    do {
                      cVar2 = "module %s (\n    "[lVar20 + 0xb];
                      if (iVar23 == pVVar5->nCap) {
                        if (iVar23 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          pVVar5->pArray = pcVar12;
                          pVVar5->nCap = 0x10;
                        }
                        else {
                          uVar29 = iVar23 * 2;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc((ulong)uVar29);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,(ulong)uVar29);
                          }
                          pVVar5->pArray = pcVar12;
                          pVVar5->nCap = uVar29;
                        }
                      }
                      else {
                        pcVar12 = pVVar5->pArray;
                      }
                      iVar10 = pVVar5->nSize;
                      pVVar5->nSize = iVar10 + 1;
                      pcVar12[iVar10] = cVar2;
                      lVar20 = lVar20 + 1;
                      iVar23 = pVVar5->nSize;
                      iVar10 = iVar11;
                    } while (lVar20 != 5);
                  }
                  if (iVar23 == pVVar5->nCap) {
                    if (iVar23 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      uVar29 = iVar23 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc((ulong)uVar29);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,(ulong)uVar29);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = uVar29;
                    }
                  }
                  else {
                    pcVar12 = pVVar5->pArray;
                  }
                  iVar11 = pVVar5->nSize;
                  pVVar5->nSize = iVar11 + 1;
                  pcVar12[iVar11] = '.';
                  cVar2 = *(char *)(lVar30 + uVar31);
                  uVar29 = pVVar5->nSize;
                  if (uVar29 == pVVar5->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar5->pArray;
                  }
                  iVar11 = pVVar5->nSize;
                  pVVar5->nSize = iVar11 + 1;
                  pcVar12[iVar11] = cVar2;
                  uVar29 = pVVar5->nSize;
                  if (uVar29 == pVVar5->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar5->pArray;
                  }
                  iVar11 = pVVar5->nSize;
                  pVVar5->nSize = iVar11 + 1;
                  pcVar12[iVar11] = '(';
                  Bac_ManWriteConcat(p,(int)uVar15,iVar19);
                  uVar29 = pVVar5->nSize;
                  if (uVar29 == pVVar5->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar5->pArray;
                  }
                  iVar19 = pVVar5->nSize;
                  pVVar5->nSize = iVar19 + 1;
                  pcVar12[iVar19] = ')';
                  uVar31 = (ulong)(iVar17 + 1);
                }
                bVar7 = 1 < (long)uVar25;
                uVar25 = uVar15;
              } while (bVar7);
            }
            uVar15 = (ulong)(p->vType).nSize;
            uVar25 = local_68;
            if ((long)uVar28 < (long)uVar15) {
              do {
                bVar16 = (p->vType).pArray[uVar25];
                if ((bVar16 & 0xfe) != 8) break;
                if ((bVar16 & 1) == 0) {
                  iVar17 = (int)uVar31;
                  if ((iVar17 < 0) || (DAT_00cbf324 <= iVar17)) goto LAB_003a12d7;
                  iVar19 = DAT_00cbf328[uVar31];
                  if (iVar17 != 0) {
                    lVar20 = 0;
                    do {
                      cVar2 = "    \"%s\", "[lVar20 + 8];
                      uVar29 = pVVar5->nSize;
                      if (uVar29 == pVVar5->nCap) {
                        if ((int)uVar29 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          pVVar5->pArray = pcVar12;
                          pVVar5->nCap = 0x10;
                        }
                        else {
                          sVar14 = (ulong)uVar29 * 2;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(sVar14);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                          }
                          pVVar5->pArray = pcVar12;
                          pVVar5->nCap = (int)sVar14;
                        }
                      }
                      else {
                        pcVar12 = pVVar5->pArray;
                      }
                      iVar11 = pVVar5->nSize;
                      pVVar5->nSize = iVar11 + 1;
                      pcVar12[iVar11] = cVar2;
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 2);
                  }
                  iVar11 = pVVar5->nSize;
                  iVar23 = iVar11;
                  if (iVar10 + 0x46 < iVar11) {
                    lVar20 = 0;
                    do {
                      cVar2 = "module %s (\n    "[lVar20 + 0xb];
                      if (iVar23 == pVVar5->nCap) {
                        if (iVar23 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          pVVar5->pArray = pcVar12;
                          pVVar5->nCap = 0x10;
                        }
                        else {
                          uVar29 = iVar23 * 2;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar12 = (char *)malloc((ulong)uVar29);
                          }
                          else {
                            pcVar12 = (char *)realloc(pVVar5->pArray,(ulong)uVar29);
                          }
                          pVVar5->pArray = pcVar12;
                          pVVar5->nCap = uVar29;
                        }
                      }
                      else {
                        pcVar12 = pVVar5->pArray;
                      }
                      iVar10 = pVVar5->nSize;
                      pVVar5->nSize = iVar10 + 1;
                      pcVar12[iVar10] = cVar2;
                      lVar20 = lVar20 + 1;
                      iVar23 = pVVar5->nSize;
                      iVar10 = iVar11;
                    } while (lVar20 != 5);
                  }
                  if (iVar23 == pVVar5->nCap) {
                    if (iVar23 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      uVar29 = iVar23 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc((ulong)uVar29);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,(ulong)uVar29);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = uVar29;
                    }
                  }
                  else {
                    pcVar12 = pVVar5->pArray;
                  }
                  iVar11 = pVVar5->nSize;
                  pVVar5->nSize = iVar11 + 1;
                  pcVar12[iVar11] = '.';
                  cVar2 = *(char *)(lVar30 + uVar31);
                  uVar29 = pVVar5->nSize;
                  if (uVar29 == pVVar5->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar5->pArray;
                  }
                  iVar11 = pVVar5->nSize;
                  pVVar5->nSize = iVar11 + 1;
                  pcVar12[iVar11] = cVar2;
                  uVar29 = pVVar5->nSize;
                  if (uVar29 == pVVar5->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar5->pArray;
                  }
                  iVar11 = pVVar5->nSize;
                  pVVar5->nSize = iVar11 + 1;
                  pcVar12[iVar11] = '(';
                  Bac_ManWriteConcat(p,(int)uVar25,iVar19);
                  uVar29 = pVVar5->nSize;
                  if (uVar29 == pVVar5->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                      }
                      pVVar5->pArray = pcVar12;
                      pVVar5->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar5->pArray;
                  }
                  iVar19 = pVVar5->nSize;
                  pVVar5->nSize = iVar19 + 1;
                  pcVar12[iVar19] = ')';
                  uVar31 = (ulong)(iVar17 + 1);
                  uVar15 = (ulong)(uint)(p->vType).nSize;
                }
                uVar25 = uVar25 + 1;
              } while ((int)uVar25 < (int)uVar15);
            }
            if ((int)uVar31 != DAT_00cbf324) {
              __assert_fail("iSig == Vec_IntSize(vBits)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x240,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
          }
          lVar30 = 0;
          do {
            cVar2 = "\n  );\n"[lVar30 + 3];
            uVar29 = pVVar5->nSize;
            if (uVar29 == pVVar5->nCap) {
              if ((int)uVar29 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = 0x10;
              }
              else {
                sVar14 = (ulong)uVar29 * 2;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar14);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,sVar14);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = (int)sVar14;
              }
            }
            else {
              pcVar12 = pVVar5->pArray;
            }
            iVar10 = pVVar5->nSize;
            pVVar5->nSize = iVar10 + 1;
            pcVar12[iVar10] = cVar2;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 3);
        }
        else {
          pVVar24 = p->pDesign->vOut;
          iVar10 = local_a8 + -1;
          uVar28 = uVar21;
          do {
            if ((long)uVar28 < 1) {
              iVar17 = 0;
              goto LAB_0039eda5;
            }
            if ((uint)uVar31 <= local_a8 - 1U) goto LAB_003a127a;
            lVar30 = uVar28 - 1;
            uVar28 = uVar28 - 1;
          } while ((pcVar12[lVar30] & 0xfeU) == 6);
          iVar17 = (int)uVar28 + 1;
LAB_0039eda5:
          uVar28 = local_68;
          iVar19 = local_6c;
          do {
            iVar11 = (uint)uVar31 - 1;
            if ((uVar31 & 0xffffffff) <= uVar28) break;
            pbVar1 = (byte *)(pcVar12 + uVar28);
            iVar19 = iVar19 + 1;
            uVar28 = uVar28 + 1;
            iVar11 = iVar19;
          } while ((*pbVar1 & 0xfe) == 8);
          if (iVar11 - local_a8 != 1) {
            __assert_fail("nOutputs == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                          ,0x1ad,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
          }
          lVar30 = 0;
          do {
            cVar2 = "  assign "[lVar30];
            uVar18 = pVVar24->nSize;
            if (uVar18 == pVVar24->nCap) {
              if ((int)uVar18 < 0x10) {
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = 0x10;
              }
              else {
                sVar14 = (ulong)uVar18 * 2;
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar14);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = (int)sVar14;
              }
            }
            else {
              pcVar12 = pVVar24->pArray;
            }
            iVar19 = pVVar24->nSize;
            pVVar24->nSize = iVar19 + 1;
            pcVar12[iVar19] = cVar2;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 9);
          Bac_ManWriteSig(p,local_a8 + 1);
          lVar30 = 0;
          do {
            cVar2 = "Const0 (%d) = "[lVar30 + 0xb];
            uVar18 = pVVar24->nSize;
            if (uVar18 == pVVar24->nCap) {
              if ((int)uVar18 < 0x10) {
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = 0x10;
              }
              else {
                sVar14 = (ulong)uVar18 * 2;
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar14);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = (int)sVar14;
              }
            }
            else {
              pcVar12 = pVVar24->pArray;
            }
            iVar19 = pVVar24->nSize;
            pVVar24->nSize = iVar19 + 1;
            pcVar12[iVar19] = cVar2;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 3);
          if (local_a8 - iVar17 == 2) {
            if ((bVar9 < 0x14) && ((0xaa000U >> (uVar29 & 0x1f) & 1) != 0)) {
              uVar18 = pVVar24->nSize;
              if (uVar18 == pVVar24->nCap) {
                if ((int)uVar18 < 0x10) {
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar18 * 2;
                  if (pVVar24->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                  }
                  pVVar24->pArray = pcVar12;
                  pVVar24->nCap = (int)sVar14;
                }
              }
              else {
                pcVar12 = pVVar24->pArray;
              }
              iVar10 = pVVar24->nSize;
              pVVar24->nSize = iVar10 + 1;
              pcVar12[iVar10] = '~';
            }
            Bac_ManWriteSig(p,local_a8 - 1U);
            switch(uVar29) {
            case 0xc:
            case 0x13:
              lVar30 = 0;
              do {
                cVar2 = " := %s & "[lVar30 + 6];
                uVar29 = pVVar24->nSize;
                if (uVar29 == pVVar24->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar29 * 2;
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar12 = pVVar24->pArray;
                }
                iVar10 = pVVar24->nSize;
                pVVar24->nSize = iVar10 + 1;
                pcVar12[iVar10] = cVar2;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 3);
              break;
            case 0xd:
              lVar30 = 0;
              do {
                cVar2 = " | ~"[lVar30];
                uVar29 = pVVar24->nSize;
                if (uVar29 == pVVar24->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar29 * 2;
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar12 = pVVar24->pArray;
                }
                iVar10 = pVVar24->nSize;
                pVVar24->nSize = iVar10 + 1;
                pcVar12[iVar10] = cVar2;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 4);
              break;
            case 0xe:
              lVar30 = 0;
              do {
                cVar2 = "All%d =%10d | "[lVar30 + 0xb];
                uVar29 = pVVar24->nSize;
                if (uVar29 == pVVar24->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar29 * 2;
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar12 = pVVar24->pArray;
                }
                iVar10 = pVVar24->nSize;
                pVVar24->nSize = iVar10 + 1;
                pcVar12[iVar10] = cVar2;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 3);
              break;
            case 0xf:
            case 0x12:
              lVar30 = 0;
              do {
                cVar2 = " & ~"[lVar30];
                uVar29 = pVVar24->nSize;
                if (uVar29 == pVVar24->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar29 * 2;
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar12 = pVVar24->pArray;
                }
                iVar10 = pVVar24->nSize;
                pVVar24->nSize = iVar10 + 1;
                pcVar12[iVar10] = cVar2;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 4);
              break;
            default:
              if ((uVar29 & 0xfffffffe) != 0x10) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x1d3,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
              }
              lVar30 = 0;
              do {
                cVar2 = " ^ "[lVar30];
                uVar29 = pVVar24->nSize;
                if (uVar29 == pVVar24->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar29 * 2;
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar12 = pVVar24->pArray;
                }
                iVar10 = pVVar24->nSize;
                pVVar24->nSize = iVar10 + 1;
                pcVar12[iVar10] = cVar2;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 3);
            }
            iVar10 = local_a8 + -2;
LAB_003a119d:
            Bac_ManWriteSig(p,iVar10);
          }
          else {
            if (local_a8 - iVar17 == 1) {
              if (bVar9 != 10) {
                if (uVar29 != 0xb) {
                  __assert_fail("Type == BAC_BOX_BUF",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                                ,0x1c1,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
                }
                uVar29 = pVVar24->nSize;
                if (uVar29 == pVVar24->nCap) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = 0x10;
                  }
                  else {
                    sVar14 = (ulong)uVar29 * 2;
                    if (pVVar24->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar14);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                    }
                    pVVar24->pArray = pcVar12;
                    pVVar24->nCap = (int)sVar14;
                  }
                }
                else {
                  pcVar12 = pVVar24->pArray;
                }
                iVar17 = pVVar24->nSize;
                pVVar24->nSize = iVar17 + 1;
                pcVar12[iVar17] = '~';
              }
              goto LAB_003a119d;
            }
            if (local_a8 == iVar17) {
              switch(uVar29) {
              case 6:
                lVar30 = 0;
                do {
                  cVar2 = "1\'b0"[lVar30];
                  uVar29 = pVVar24->nSize;
                  if (uVar29 == pVVar24->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                      }
                      pVVar24->pArray = pcVar12;
                      pVVar24->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                      }
                      pVVar24->pArray = pcVar12;
                      pVVar24->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar24->pArray;
                  }
                  iVar10 = pVVar24->nSize;
                  pVVar24->nSize = iVar10 + 1;
                  pcVar12[iVar10] = cVar2;
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 4);
                break;
              case 7:
                lVar30 = 0;
                do {
                  cVar2 = "1\'b1"[lVar30];
                  uVar29 = pVVar24->nSize;
                  if (uVar29 == pVVar24->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                      }
                      pVVar24->pArray = pcVar12;
                      pVVar24->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                      }
                      pVVar24->pArray = pcVar12;
                      pVVar24->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar24->pArray;
                  }
                  iVar10 = pVVar24->nSize;
                  pVVar24->nSize = iVar10 + 1;
                  pcVar12[iVar10] = cVar2;
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 4);
                break;
              case 8:
                lVar30 = 0;
                do {
                  cVar2 = "1\'bx"[lVar30];
                  uVar29 = pVVar24->nSize;
                  if (uVar29 == pVVar24->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                      }
                      pVVar24->pArray = pcVar12;
                      pVVar24->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                      }
                      pVVar24->pArray = pcVar12;
                      pVVar24->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar24->pArray;
                  }
                  iVar10 = pVVar24->nSize;
                  pVVar24->nSize = iVar10 + 1;
                  pcVar12[iVar10] = cVar2;
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 4);
                break;
              case 9:
                lVar30 = 0;
                do {
                  cVar2 = "1\'bz"[lVar30];
                  uVar29 = pVVar24->nSize;
                  if (uVar29 == pVVar24->nCap) {
                    if ((int)uVar29 < 0x10) {
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                      }
                      pVVar24->pArray = pcVar12;
                      pVVar24->nCap = 0x10;
                    }
                    else {
                      sVar14 = (ulong)uVar29 * 2;
                      if (pVVar24->pArray == (char *)0x0) {
                        pcVar12 = (char *)malloc(sVar14);
                      }
                      else {
                        pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                      }
                      pVVar24->pArray = pcVar12;
                      pVVar24->nCap = (int)sVar14;
                    }
                  }
                  else {
                    pcVar12 = pVVar24->pArray;
                  }
                  iVar10 = pVVar24->nSize;
                  pVVar24->nSize = iVar10 + 1;
                  pcVar12[iVar10] = cVar2;
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 4);
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x1bb,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
              }
            }
          }
          lVar30 = 0;
          do {
            cVar2 = " .%s(%s) ) ;\n"[lVar30 + 0xb];
            uVar29 = pVVar24->nSize;
            if (uVar29 == pVVar24->nCap) {
              if ((int)uVar29 < 0x10) {
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,0x10);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = 0x10;
              }
              else {
                sVar14 = (ulong)uVar29 * 2;
                if (pVVar24->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar14);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar24->pArray,sVar14);
                }
                pVVar24->pArray = pcVar12;
                pVVar24->nCap = (int)sVar14;
              }
            }
            else {
              pcVar12 = pVVar24->pArray;
            }
            iVar10 = pVVar24->nSize;
            pVVar24->nSize = iVar10 + 1;
            pcVar12[iVar10] = cVar2;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 2);
        }
      }
      uVar21 = uVar21 + 1;
      uVar31 = (ulong)(p->vType).nSize;
      local_68 = local_68 + 1;
      local_6c = local_6c + 1;
      local_40 = local_40 + -1;
      uVar3 = uVar3 + 1;
      local_50 = local_50 + 1;
    } while ((long)uVar21 < (long)uVar31);
  }
  return;
}

Assistant:

void Bac_ManWriteVerilogBoxes( Bac_Ntk_t * p, int fUseAssign )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    int iObj, k, i, o, StartPos;
    Bac_NtkForEachBox( p, iObj ) // .subckt/.gate/box (formal/actual binding) 
    {
        // skip constants
        if ( Bac_ObjIsConst(p, iObj) )
            continue;
        // write mapped
        if ( Bac_ObjIsGate(p, iObj) )
        {
            Bac_ManWriteGate( p, iObj );
            continue;
        }
        // write primitives as assign-statements
        if ( !Bac_ObjIsBoxUser(p, iObj) && fUseAssign )
        {
            Bac_ManWriteAssign( p, iObj );
            continue;
        }
        // write header
        StartPos = Vec_StrSize(vStr);
        if ( Bac_ObjIsBoxUser(p, iObj) )
        {
            int Value, Beg, End, Range;
            Bac_Ntk_t * pModel = Bac_BoxNtk( p, iObj );
            Vec_StrPrintStr( vStr, "  " );
            Vec_StrPrintStr( vStr, Bac_NtkName(pModel) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Bac_ObjName(p, iObj) ? Bac_ObjNameStr(p, iObj) : ""  );
            Vec_StrPrintStr( vStr, " (" );
            // write arguments
            i = o = 0;
            assert( Bac_NtkInfoNum(pModel) );
            Vec_IntForEachEntryTriple( &pModel->vInfo, Value, Beg, End, k )
            {
                int NameId = Abc_Lit2Var2( Value );
                int Type = Abc_Lit2Att2( Value );
                Vec_StrPrintStr( vStr, k ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPrintStr( vStr, Bac_NtkStr(p, NameId) );
                Vec_StrPrintStr( vStr, "(" );
                Range = Bac_InfoRange( Beg, End );
                assert( Range > 0 );
                if ( Type == 1 )
                    Bac_ManWriteConcat( p, Bac_BoxBi(p, iObj, i), Range ), i += Range;
                else if ( Type == 2 )
                    Bac_ManWriteConcat( p, Bac_BoxBo(p, iObj, o), Range ), o += Range;
                else assert( 0 );
                Vec_StrPrintStr( vStr, ")" );
            }
            assert( i == Bac_BoxBiNum(p, iObj) );
            assert( o == Bac_BoxBoNum(p, iObj) );
        }
        else
        {
            int iTerm, k, Range, iSig = 0;
            Vec_Int_t * vBits = Bac_BoxCollectRanges( p, iObj );
            char * pName = Bac_NtkGenerateName( p, Bac_ObjType(p, iObj), vBits );
            char * pSymbs = Bac_ManPrimSymb( p->pDesign, Bac_ObjType(p, iObj) );
            Vec_StrPrintStr( vStr, "  " );
            Vec_StrPrintStr( vStr, pName );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Bac_ObjName(p, iObj) ? Bac_ObjNameStr(p, iObj) : ""  );
            Vec_StrPrintStr( vStr, " (" );
            // write inputs
            Bac_BoxForEachBiMain( p, iObj, iTerm, k )
            {
                Range = Vec_IntEntry( vBits, iSig );
                Vec_StrPrintStr( vStr, iSig ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPush( vStr, pSymbs[iSig] );
                Vec_StrPrintStr( vStr, "(" );
                Bac_ManWriteConcat( p, iTerm, Range );
                Vec_StrPrintStr( vStr, ")" );
                iSig++;
            }
            Bac_BoxForEachBoMain( p, iObj, iTerm, k )
            {
                Range = Vec_IntEntry( vBits, iSig );
                Vec_StrPrintStr( vStr, iSig ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPush( vStr, pSymbs[iSig] );
                Vec_StrPrintStr( vStr, "(" );
                Bac_ManWriteConcat( p, iTerm, Range );
                Vec_StrPrintStr( vStr, ")" );
                iSig++;
            }
            assert( iSig == Vec_IntSize(vBits) );
        }
        Vec_StrPrintStr( vStr, ");\n" );
    }
}